

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ranges.c
# Opt level: O0

int quicly_ranges_add(quicly_ranges_t *ranges,uint64_t start,uint64_t end)

{
  int iVar1;
  size_t slot_00;
  ulong in_RDX;
  ulong in_RSI;
  quicly_ranges_t *in_RDI;
  bool bVar2;
  size_t unaff_retaddr;
  size_t end_slot;
  size_t slot;
  size_t end_slot_00;
  size_t slot_01;
  
  if (in_RDX < in_RSI) {
    __assert_fail("start <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/ranges.c"
                  ,0x65,"int quicly_ranges_add(quicly_ranges_t *, uint64_t, uint64_t)");
  }
  if (in_RSI == in_RDX) {
    return 0;
  }
  if (in_RDI->num_ranges == 0) {
    iVar1 = insert_at((quicly_ranges_t *)end,slot,end_slot,unaff_retaddr);
    return iVar1;
  }
  if (in_RDI->ranges[in_RDI->num_ranges - 1].end < in_RSI) {
    iVar1 = insert_at((quicly_ranges_t *)end,slot,end_slot,unaff_retaddr);
    return iVar1;
  }
  end_slot_00 = in_RDI->num_ranges;
  do {
    end_slot_00 = end_slot_00 - 1;
    slot_01 = end_slot_00;
    if (in_RDI->ranges[end_slot_00].start <= in_RDX) {
      while( true ) {
        if (in_RDI->ranges[slot_01].end == in_RSI) {
          iVar1 = merge_update(in_RDI,in_RSI,in_RDX,slot_01,end_slot_00);
          return iVar1;
        }
        if (in_RDI->ranges[slot_01].end < in_RSI) break;
        slot_00 = slot_01 - 1;
        bVar2 = slot_01 == 0;
        slot_01 = slot_00;
        if (bVar2) {
          iVar1 = merge_update(in_RDI,in_RSI,in_RDX,slot_00,end_slot_00);
          return iVar1;
        }
      }
      if (slot_01 == end_slot_00) {
        iVar1 = insert_at((quicly_ranges_t *)end,slot,end_slot,unaff_retaddr);
        return iVar1;
      }
      iVar1 = merge_update(in_RDI,in_RSI,in_RDX,slot_01 + 1,end_slot_00);
      return iVar1;
    }
  } while (end_slot_00 != 0);
  iVar1 = insert_at((quicly_ranges_t *)end,slot,end_slot,unaff_retaddr);
  return iVar1;
}

Assistant:

int quicly_ranges_add(quicly_ranges_t *ranges, uint64_t start, uint64_t end)
{
    size_t slot, end_slot;

    assert(start <= end);

    if (start == end)
        return 0;

    if (ranges->num_ranges == 0) {
        return insert_at(ranges, start, end, 0);
    } else if (ranges->ranges[ranges->num_ranges - 1].end < start) {
        return insert_at(ranges, start, end, ranges->num_ranges);
    }

    /* find the slot that should contain `end` */
    for (slot = ranges->num_ranges - 1;; --slot) {
        if (ranges->ranges[slot].start <= end)
            break;
        if (slot == 0)
            return insert_at(ranges, start, end, 0);
    }
    end_slot = slot;

    /* find the slot that should contain `start` */
    do {
        if (ranges->ranges[slot].end == start) {
            return merge_update(ranges, start, end, slot, end_slot);
        } else if (ranges->ranges[slot].end < start) {
            if (slot++ == end_slot) {
                return insert_at(ranges, start, end, slot);
            } else {
                return merge_update(ranges, start, end, slot, end_slot);
            }
        }
    } while (slot-- != 0);

    return merge_update(ranges, start, end, 0, end_slot);
}